

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KillReceiver.cpp
# Opt level: O0

void __thiscall KillReceiver::KillReceiver(KillReceiver *this)

{
  int iVar1;
  undefined1 local_c8 [4];
  int fd;
  sigset_t mask;
  allocator<char> local_31;
  string local_30;
  KillReceiver *local_10;
  KillReceiver *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"KillReceiver",&local_31);
  Subscriber::Subscriber(&this->super_Subscriber,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_001edc78;
  sigemptyset((sigset_t *)local_c8);
  sigaddset((sigset_t *)local_c8,2);
  iVar1 = sigprocmask(0,(sigset_t *)local_c8,(sigset_t *)0x0);
  no_err(iVar1,"sigprocmask failed");
  iVar1 = signalfd(-1,(sigset_t *)local_c8,0);
  Subscriber::set_fd(&this->super_Subscriber,iVar1);
  Subscriber::set_expected(&this->super_Subscriber,0x19);
  return;
}

Assistant:

KillReceiver::KillReceiver() : Subscriber("KillReceiver") {
    sigset_t mask;
    sigemptyset (&mask);
    sigaddset (&mask, SIGINT);
    no_err(sigprocmask(SIG_BLOCK, &mask, NULL), "sigprocmask failed");
    int fd = signalfd(-1, &mask, 0);
    set_fd(fd);
    set_expected(POLLIN | POLLERR | POLLHUP);
}